

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseAttrib(Parser *this,AttributeSelector *attr)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  TokenType in_stack_ffffffffffffffa4;
  Parser *this_00;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  skipSpace((Parser *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  bVar2 = next(in_RDI,in_stack_ffffffffffffffa4);
  if (bVar2) {
    lexem(in_RDI);
    QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
    QString::~QString((QString *)0xa3c854);
    skipSpace((Parser *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    bVar2 = test(in_RDI,in_stack_ffffffffffffffa4);
    if (bVar2) {
      *(undefined4 *)(in_RSI + 0x30) = 1;
    }
    else {
      bVar2 = test(in_RDI,in_stack_ffffffffffffffa4);
      if (bVar2) {
        *(undefined4 *)(in_RSI + 0x30) = 2;
      }
      else {
        bVar2 = test(in_RDI,in_stack_ffffffffffffffa4);
        if (bVar2) {
          *(undefined4 *)(in_RSI + 0x30) = 3;
        }
        else {
          bVar2 = test(in_RDI,in_stack_ffffffffffffffa4);
          if (bVar2) {
            *(undefined4 *)(in_RSI + 0x30) = 4;
          }
          else {
            bVar2 = test(in_RDI,in_stack_ffffffffffffffa4);
            if (bVar2) {
              *(undefined4 *)(in_RSI + 0x30) = 5;
            }
            else {
              bVar2 = test(in_RDI,in_stack_ffffffffffffffa4);
              if (!bVar2) {
                local_39 = next(in_RDI,in_stack_ffffffffffffffa4);
                goto LAB_00a3c9df;
              }
              *(undefined4 *)(in_RSI + 0x30) = 6;
            }
          }
        }
      }
    }
    skipSpace((Parser *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    bVar2 = test(in_RDI,in_stack_ffffffffffffffa4);
    if ((bVar2) || (bVar2 = test(in_RDI,in_stack_ffffffffffffffa4), bVar2)) {
      unquotedLexem(this_00);
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
      QString::~QString((QString *)0xa3c9c0);
      skipSpace((Parser *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      local_39 = next(in_RDI,in_stack_ffffffffffffffa4);
    }
    else {
      local_39 = false;
    }
  }
  else {
    local_39 = false;
  }
LAB_00a3c9df:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool Parser::parseAttrib(AttributeSelector *attr)
{
    skipSpace();
    if (!next(IDENT)) return false;
    attr->name = lexem();
    skipSpace();

    if (test(EQUAL)) {
        attr->valueMatchCriterium = AttributeSelector::MatchEqual;
    } else if (test(INCLUDES)) {
        attr->valueMatchCriterium = AttributeSelector::MatchIncludes;
    } else if (test(DASHMATCH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchDashMatch;
    } else if (test(BEGINSWITH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchBeginsWith;
    } else if (test(ENDSWITH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchEndsWith;
    } else if (test(CONTAINS)) {
        attr->valueMatchCriterium = AttributeSelector::MatchContains;
    } else {
        return next(RBRACKET);
    }

    skipSpace();

    if (!test(IDENT) && !test(STRING)) return false;
    attr->value = unquotedLexem();

    skipSpace();
    return next(RBRACKET);
}